

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
TransformPromiseNode<kj::Own<capnp::ClientHook>,_kj::Own<capnp::PipelineHook>,_kj::CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++:411:9),_kj::Array<capnp::PipelineOp>_>,_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Own<capnp::ClientHook>,_kj::Own<capnp::PipelineHook>,_kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:411:9),_kj::Array<capnp::PipelineOp>_>,_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  Exception *in;
  ExceptionOr<kj::Own<capnp::ClientHook>_> *pEVar1;
  Own<capnp::PipelineHook> *in_00;
  Own<capnp::ClientHook> local_5f0;
  ExceptionOr<kj::Own<capnp::ClientHook>_> local_5e0;
  Own<capnp::PipelineHook> *local_470;
  Own<capnp::PipelineHook> *depValue;
  ExceptionOr<kj::Own<capnp::ClientHook>_> local_310;
  Exception *local_1a0;
  Exception *depException;
  undefined1 local_188 [8];
  ExceptionOr<kj::Own<capnp::PipelineHook>_> depResult;
  ExceptionOrValue *output_local;
  TransformPromiseNode<kj::Own<capnp::ClientHook>,_kj::Own<capnp::PipelineHook>,_kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:411:9),_kj::Array<capnp::PipelineOp>_>,_kj::_::PropagateException>
  *this_local;
  
  depResult.value.ptr.ptr = (PipelineHook *)output;
  ExceptionOr<kj::Own<capnp::PipelineHook>_>::ExceptionOr
            ((ExceptionOr<kj::Own<capnp::PipelineHook>_> *)local_188);
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,(ExceptionOrValue *)local_188);
  local_1a0 = readMaybe<kj::Exception>((Maybe<kj::Exception> *)local_188);
  if (local_1a0 == (Exception *)0x0) {
    local_470 = readMaybe<capnp::PipelineHook>
                          ((Maybe<kj::Own<capnp::PipelineHook>_> *)
                           ((long)&depResult.super_ExceptionOrValue.exception.ptr.field_1 + 0x150));
    if (local_470 != (Own<capnp::PipelineHook> *)0x0) {
      in_00 = mv<kj::Own<capnp::PipelineHook>>(local_470);
      MaybeVoidCaller<kj::Own<capnp::PipelineHook>,kj::Own<capnp::ClientHook>>::
      apply<kj::CaptureByMove<capnp::QueuedPipeline::getPipelinedCap(kj::Array<capnp::PipelineOp>&&)::__0,kj::Array<capnp::PipelineOp>>>
                ((MaybeVoidCaller<kj::Own<capnp::PipelineHook>,kj::Own<capnp::ClientHook>> *)
                 &local_5f0,&this->func,in_00);
      handle(&local_5e0,this,&local_5f0);
      pEVar1 = ExceptionOrValue::as<kj::Own<capnp::ClientHook>>
                         ((ExceptionOrValue *)depResult.value.ptr.ptr);
      ExceptionOr<kj::Own<capnp::ClientHook>_>::operator=(pEVar1,&local_5e0);
      ExceptionOr<kj::Own<capnp::ClientHook>_>::~ExceptionOr(&local_5e0);
      Own<capnp::ClientHook>::~Own(&local_5f0);
    }
  }
  else {
    in = mv<kj::Exception>(local_1a0);
    MaybeVoidCaller<kj::Exception,_kj::_::PropagateException::Bottom>::
    apply<kj::_::PropagateException>((Bottom *)&depValue,(PropagateException *)&this->field_0x40,in)
    ;
    handle(&local_310,this,(Bottom *)&depValue);
    pEVar1 = ExceptionOrValue::as<kj::Own<capnp::ClientHook>>
                       ((ExceptionOrValue *)depResult.value.ptr.ptr);
    ExceptionOr<kj::Own<capnp::ClientHook>_>::operator=(pEVar1,&local_310);
    ExceptionOr<kj::Own<capnp::ClientHook>_>::~ExceptionOr(&local_310);
    PropagateException::Bottom::~Bottom((Bottom *)&depValue);
  }
  ExceptionOr<kj::Own<capnp::PipelineHook>_>::~ExceptionOr
            ((ExceptionOr<kj::Own<capnp::PipelineHook>_> *)local_188);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }